

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void __thiscall
vkt::BindingModel::anon_unknown_1::ComputePipeline::ComputePipeline
          (ComputePipeline *this,DeviceInterface *vki,VkDevice device,
          BinaryCollection *programCollection,deUint32 numDescriptorSets,
          VkDescriptorSetLayout *descriptorSetLayouts)

{
  RefData<vk::Handle<(vk::HandleType)16>_> data;
  RefData<vk::Handle<(vk::HandleType)18>_> data_00;
  BinaryCollection *programCollection_00;
  BinaryCollection *device_00;
  VkDevice vki_00;
  Handle<(vk::HandleType)16> *pHVar1;
  Move<vk::Handle<(vk::HandleType)18>_> local_c8;
  RefData<vk::Handle<(vk::HandleType)18>_> local_a8;
  Move<vk::Handle<(vk::HandleType)16>_> local_78;
  RefData<vk::Handle<(vk::HandleType)16>_> local_58;
  VkDescriptorSetLayout *local_38;
  VkDescriptorSetLayout *descriptorSetLayouts_local;
  BinaryCollection *pBStack_28;
  deUint32 numDescriptorSets_local;
  BinaryCollection *programCollection_local;
  VkDevice device_local;
  DeviceInterface *vki_local;
  ComputePipeline *this_local;
  
  local_38 = descriptorSetLayouts;
  descriptorSetLayouts_local._4_4_ = numDescriptorSets;
  pBStack_28 = programCollection;
  programCollection_local = (BinaryCollection *)device;
  device_local = (VkDevice)vki;
  vki_local = (DeviceInterface *)this;
  createPipelineLayout(&local_78,vki,device,numDescriptorSets,descriptorSetLayouts);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_58,(Move *)&local_78);
  data.deleter.m_deviceIface = local_58.deleter.m_deviceIface;
  data.object.m_internal = local_58.object.m_internal;
  data.deleter.m_device = local_58.deleter.m_device;
  data.deleter.m_allocator = local_58.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique(&this->m_pipelineLayout,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_78);
  vki_00 = device_local;
  device_00 = programCollection_local;
  programCollection_00 = pBStack_28;
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)16>_> *)this);
  createPipeline(&local_c8,(DeviceInterface *)vki_00,(VkDevice)device_00,programCollection_00,
                 (VkPipelineLayout)pHVar1->m_internal);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_a8,(Move *)&local_c8);
  data_00.deleter.m_deviceIface = local_a8.deleter.m_deviceIface;
  data_00.object.m_internal = local_a8.object.m_internal;
  data_00.deleter.m_device = local_a8.deleter.m_device;
  data_00.deleter.m_allocator = local_a8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique(&this->m_pipeline,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_c8);
  return;
}

Assistant:

ComputePipeline::ComputePipeline (const vk::DeviceInterface&		vki,
								  vk::VkDevice						device,
								  const vk::BinaryCollection&		programCollection,
								  deUint32							numDescriptorSets,
								  const vk::VkDescriptorSetLayout*	descriptorSetLayouts)
	: m_pipelineLayout	(createPipelineLayout(vki, device, numDescriptorSets, descriptorSetLayouts))
	, m_pipeline		(createPipeline(vki, device, programCollection, *m_pipelineLayout))
{
}